

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingUtils.h
# Opt level: O1

void NextToken(char **car,char *end)

{
  byte *pbVar1;
  
  pbVar1 = (byte *)*car;
  while (((ulong)*pbVar1 < 0x21 && ((0x100002600U >> ((ulong)*pbVar1 & 0x3f) & 1) != 0))) {
    pbVar1 = pbVar1 + 1;
  }
  *car = (char *)pbVar1;
  while (((pbVar1 < end && ((ulong)*pbVar1 < 0x24)) &&
         ((0x800002400U >> ((ulong)*pbVar1 & 0x3f) & 1) != 0))) {
    while ((0xd < *pbVar1 || ((0x2401U >> (*pbVar1 & 0x1f) & 1) == 0))) {
      pbVar1 = pbVar1 + 1;
    }
    for (; (*pbVar1 == 0xd || (*pbVar1 == 10)); pbVar1 = pbVar1 + 1) {
    }
    *car = (char *)pbVar1;
    while (((ulong)*pbVar1 < 0x21 && ((0x100002600U >> ((ulong)*pbVar1 & 0x3f) & 1) != 0))) {
      pbVar1 = pbVar1 + 1;
    }
    *car = (char *)pbVar1;
  }
  return;
}

Assistant:

AI_FORCE_INLINE
bool SkipSpacesAndLineEnd( const char_t** inout) {
    return SkipSpacesAndLineEnd<char_t>(*inout,inout);
}